

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  bool reduce_c;
  int i_1;
  int iVar3;
  undefined8 in_RAX;
  Mat *pMVar4;
  Mat *pMVar5;
  uint uVar6;
  undefined4 uVar7;
  Mat *pMVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  Mat *pMVar13;
  int q_1;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  Mat *pMVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  bool post_process;
  undefined1 post_process_00;
  int i_58;
  uint uVar22;
  uint uVar23;
  void *pvVar24;
  ulong uVar25;
  int i_60;
  int j_49;
  ulong uVar26;
  int q;
  void *pvVar27;
  float sum_2;
  float extraout_XMM0_Da;
  float fVar28;
  float extraout_XMM0_Da_00;
  float fVar29;
  undefined1 in_XMM0 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_var [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_var_03 [12];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_var_04 [12];
  float sum;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  Option *in_stack_fffffffffffffef0;
  int local_f8;
  int local_f0;
  Mat sums;
  int local_98;
  Mat local_88;
  int axes_flag [3];
  
  uVar22 = bottom_blob->dims;
  pMVar18 = (Mat *)(ulong)uVar22;
  axes_flag[2] = 0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  if (this->reduce_all == 0) {
    pvVar24 = (this->axes).data;
    uVar6 = (this->axes).w;
    uVar21 = 0;
    uVar16 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar16 = uVar21;
    }
    for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
      iVar3 = *(int *)((long)pvVar24 + uVar21 * 4);
      axes_flag[(int)(iVar3 + (iVar3 >> 0x1f & uVar22 + 1) + -1)] = 1;
    }
    auVar44 = _DAT_002d9260;
    if (uVar22 != 1) {
      if (uVar22 == 2) {
        in_XMM0._4_4_ = axes_flag[1];
        in_XMM0._0_4_ = (float)axes_flag[0];
        in_XMM0._8_8_ = 0;
        auVar44._0_4_ = -(uint)(axes_flag[0] == 1);
        auVar44._4_4_ = -(uint)(axes_flag[1] == 1);
        auVar44._8_4_ = -(uint)(axes_flag[1] == 1);
        auVar44._12_4_ = 0xffffffff;
      }
      else {
        if (uVar22 == 3) {
          uVar7 = (undefined4)CONCAT71((int7)((ulong)pvVar24 >> 8),axes_flag[0] == 1);
          in_XMM0._4_4_ = axes_flag[2];
          in_XMM0._0_4_ = (float)axes_flag[1];
          in_XMM0._8_8_ = 0;
          auVar44._0_4_ = -(uint)(axes_flag[1] == 1);
          auVar44._4_4_ = -(uint)(axes_flag[2] == 1);
          auVar44._8_4_ = -(uint)(axes_flag[2] == 1);
          auVar44._12_4_ = 0xffffffff;
          goto LAB_001dc734;
        }
        auVar44 = (undefined1  [16])0x0;
      }
    }
    uVar7 = 0;
  }
  else {
    uVar7 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    auVar44 = _DAT_002d9250;
  }
LAB_001dc734:
  if (10 < (uint)this->operation) {
    return 0;
  }
  lVar19 = auVar44._0_8_;
  lVar12 = auVar44._8_8_;
  uVar6 = (uint)auVar44._8_2_;
  reduce_c = SUB41(uVar7,0);
  bVar11 = auVar44[8];
  fVar28 = in_XMM0._0_4_;
  bVar10 = auVar44[0];
  switch(this->operation) {
  case 0:
    fVar28 = this->coeff;
    iVar15 = this->keepdims;
    auVar45._0_8_ = lVar19 << 0x3f;
    auVar45._8_8_ = lVar12 << 0x3f;
    uVar7 = movmskpd((uint)auVar44._8_2_,auVar45);
    bVar11 = (byte)uVar7;
    post_process = false;
    goto LAB_001dd749;
  case 1:
    fVar28 = this->coeff;
    post_process_00 = (undefined1)this->keepdims;
    auVar49._0_8_ = lVar19 << 0x3f;
    auVar49._8_8_ = lVar12 << 0x3f;
    uVar7 = movmskpd(uVar6,auVar49);
    bVar11 = (byte)uVar7;
    goto LAB_001dc90e;
  case 2:
    fVar28 = this->coeff;
    pMVar18 = top_blob;
    if (this->keepdims == 0) {
      auVar52._0_8_ = lVar19 << 0x3f;
      auVar52._8_8_ = lVar12 << 0x3f;
      uVar7 = movmskpd(uVar6,auVar52);
      iVar3 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar28,(bool)((byte)uVar7 >> 1),
                         (bool)((byte)uVar7 & 1),reduce_c,opt);
    }
    else {
      auVar47._0_8_ = lVar19 << 0x3f;
      auVar47._8_8_ = lVar12 << 0x3f;
      uVar7 = movmskpd(uVar6,auVar47);
      iVar3 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar28,(bool)((byte)uVar7 >> 1),
                         (bool)((byte)uVar7 & 1),reduce_c,opt);
    }
    if (iVar3 == 0) {
      if (1.1920929e-07 < ABS(fVar28 + -1.0)) {
        reduction_post_process<ncnn::post_process_identity<float>>
                  (top_blob,fVar28,(Option *)pMVar18);
        return 0;
      }
      return 0;
    }
    break;
  case 3:
    if (uVar22 == 3) {
      auVar31._0_8_ = lVar19 << 0x3f;
      auVar31._8_8_ = lVar12 << 0x3f;
      uVar22 = movmskpd(3,auVar31);
      iVar3 = 1;
      iVar15 = iVar3;
      if ((uVar22 & 2) != 0) {
        iVar15 = bottom_blob->w;
      }
      if ((uVar22 & 1) != 0) {
        iVar3 = bottom_blob->h;
      }
      iVar3 = iVar3 * iVar15;
      if (reduce_c != false) {
        iVar3 = iVar3 * bottom_blob->c;
      }
    }
    else if (uVar22 == 2) {
      auVar30._0_8_ = lVar19 << 0x3f;
      auVar30._8_8_ = lVar12 << 0x3f;
      uVar22 = movmskpd(auVar44._0_4_,auVar30);
      if ((uVar22 & 2) == 0) {
        iVar3 = 1;
      }
      else {
        iVar3 = bottom_blob->w;
      }
      if ((uVar22 & 1) != 0) {
        iVar3 = iVar3 * bottom_blob->h;
      }
    }
    else if (uVar22 == 1) {
      iVar3 = bottom_blob->w;
    }
    else {
      iVar3 = 1;
    }
    fVar28 = this->coeff / (float)iVar3;
    iVar15 = this->keepdims;
    auVar62._0_8_ = lVar19 << 0x3f;
    auVar62._8_8_ = lVar12 << 0x3f;
    uVar7 = movmskpd(iVar3,auVar62);
    bVar11 = (byte)uVar7;
    post_process = true;
LAB_001dd749:
    iVar3 = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar28,(bool)(bVar11 >> 1),(bool)(bVar11 & 1),reduce_c,
                       post_process,0.0,iVar15,opt);
    return iVar3;
  case 4:
    fVar28 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar22 == 3) {
        uVar22 = bottom_blob->w;
        lVar19 = (long)(int)uVar22;
        uVar6 = bottom_blob->h;
        uVar23 = bottom_blob->c;
        pMVar8 = (Mat *)(ulong)uVar23;
        uVar14 = uVar6 * uVar22;
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar64._0_8_ = SUB168(auVar44 ^ auVar39,0) << 0x3f;
        auVar64._8_8_ = SUB168(auVar44 ^ auVar39,8) << 0x3f;
        iVar3 = movmskpd(3,auVar64);
        bVar17 = reduce_c ^ 1;
        if (iVar3 == 0 && bVar17 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar23;
          Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
          iVar3 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar4 = (Mat *)0x0;
            if ((int)uVar14 < 1) {
              uVar14 = 0;
            }
            if ((int)uVar23 < 1) {
              pMVar8 = (Mat *)0x0;
            }
            for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              pMVar18 = bottom_blob;
              Mat::channel(&local_88,bottom_blob,(int)pMVar4);
              pvVar24 = local_88.data;
              Mat::~Mat(&local_88);
              fVar29 = -3.4028235e+38;
              for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                if (fVar29 <= fVar1) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar4 * 4) = fVar29;
            }
            fVar29 = -3.4028235e+38;
            for (pMVar4 = (Mat *)0x0; pMVar8 != pMVar4; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar4 * 4);
              if (fVar29 <= fVar1) {
                fVar29 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar29;
            iVar3 = 0;
          }
          goto LAB_001dfac3;
        }
        if (iVar3 == 0 && reduce_c == false) {
          pMVar18 = pMVar8;
          Mat::create(top_blob,uVar23,sVar2,opt->blob_allocator);
          pMVar13 = (Mat *)0x0;
          pMVar4 = (Mat *)(ulong)uVar14;
          if ((int)uVar14 < 1) {
            pMVar4 = pMVar13;
          }
          if ((int)uVar23 < 1) {
            pMVar8 = pMVar13;
          }
          for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
            pMVar18 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar13);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            fVar29 = -3.4028235e+38;
            for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar5 * 4);
              if (fVar29 <= fVar1) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)top_blob->data + (long)pMVar13 * 4) = fVar29;
          }
        }
        else {
          bVar20 = (byte)iVar3 >> 1 | bVar10;
          if (reduce_c != false || (bVar20 & 1) != 0) {
            if ((bVar20 & 1) == 0 && bVar17 == 0) {
              Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
              pMVar18 = (Mat *)0x1;
              Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
              iVar3 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,-3.4028235e+38);
                uVar14 = 0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                  Mat::channel(&local_88,bottom_blob,uVar14);
                  pvVar24 = local_88.data;
                  Mat::~Mat(&local_88);
                  pMVar18 = &sums;
                  Mat::channel(&local_88,pMVar18,uVar14);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
                    fVar29 = -3.4028235e+38;
                    for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                      fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
                      if (fVar29 <= fVar1) {
                        fVar29 = fVar1;
                      }
                    }
                    *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
                Mat::fill(top_blob,-3.4028235e+38);
                iVar3 = 0;
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = &sums;
                  Mat::channel(&local_88,&sums,uVar22);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  pvVar24 = top_blob->data;
                  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                    fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                    fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                    if (fVar29 <= fVar1) {
                      fVar29 = fVar1;
                    }
                    *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                  }
                }
              }
            }
            else {
              bVar20 = (byte)iVar3 | bVar11;
              pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar20);
              if ((bVar20 & 1) != 0 || bVar17 != 0) {
                if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                  pMVar18 = (Mat *)(ulong)uVar22;
                  Mat::create(top_blob,uVar22,uVar6,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,-3.4028235e+38);
                  uVar22 = 0;
                  if ((int)uVar14 < 1) {
                    uVar14 = 0;
                  }
                  if ((int)uVar23 < 1) {
                    uVar23 = 0;
                  }
                  for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                    pMVar18 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar22);
                    pvVar27 = sums.data;
                    Mat::~Mat(&sums);
                    pvVar24 = top_blob->data;
                    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                      fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                      fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                      if (fVar29 <= fVar1) {
                        fVar29 = fVar1;
                      }
                      *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                    }
                  }
                }
                else if (reduce_c == false && (bVar20 & 1) == 0) {
                  pMVar18 = (Mat *)(ulong)uVar22;
                  Mat::create(top_blob,uVar22,uVar23,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,-3.4028235e+38);
                  pMVar4 = (Mat *)0x0;
                  uVar16 = 0;
                  if (0 < (int)uVar22) {
                    uVar16 = (ulong)uVar22;
                  }
                  if ((int)uVar6 < 1) {
                    uVar6 = 0;
                  }
                  if ((int)uVar23 < 1) {
                    pMVar8 = pMVar4;
                  }
                  for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
                    pMVar18 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,(int)pMVar4);
                    pvVar27 = sums.data;
                    Mat::~Mat(&sums);
                    lVar12 = top_blob->elemsize * (long)pMVar4 * (long)top_blob->w;
                    pvVar24 = top_blob->data;
                    for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                      for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                        fVar1 = *(float *)((long)pvVar27 + uVar21 * 4);
                        fVar29 = *(float *)((long)pvVar24 + uVar21 * 4 + lVar12);
                        if (fVar1 <= fVar29) {
                          fVar1 = fVar29;
                        }
                        *(float *)((long)pvVar24 + uVar21 * 4 + lVar12) = fVar1;
                      }
                      pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
                    }
                  }
                }
                goto LAB_001dfad6;
              }
              Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
              pMVar18 = (Mat *)(ulong)uVar22;
              Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
              iVar3 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,-3.4028235e+38);
                uVar14 = 0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                  Mat::channel(&local_88,bottom_blob,uVar14);
                  pvVar24 = local_88.data;
                  Mat::~Mat(&local_88);
                  pMVar18 = &sums;
                  Mat::channel(&local_88,pMVar18,uVar14);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                      fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                      if (fVar1 <= fVar29) {
                        fVar1 = fVar29;
                      }
                      *(float *)((long)pvVar27 + uVar21 * 4) = fVar1;
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
                Mat::fill(top_blob,-3.4028235e+38);
                iVar3 = 0;
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = &sums;
                  Mat::channel(&local_88,&sums,uVar22);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  pvVar24 = top_blob->data;
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                    fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                    if (fVar29 <= fVar1) {
                      fVar29 = fVar1;
                    }
                    *(float *)((long)pvVar24 + uVar21 * 4) = fVar29;
                  }
                }
              }
            }
            goto LAB_001dfac3;
          }
          pMVar18 = (Mat *)(ulong)uVar6;
          Mat::create(top_blob,uVar6,uVar23,sVar2,opt->blob_allocator);
          pMVar4 = (Mat *)0x0;
          uVar16 = 0;
          if (0 < (int)uVar22) {
            uVar16 = (ulong)uVar22;
          }
          pMVar13 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar13 = pMVar4;
          }
          if ((int)uVar23 < 1) {
            pMVar8 = pMVar4;
          }
          for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            pMVar18 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar4);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            iVar3 = top_blob->w;
            sVar2 = top_blob->elemsize;
            pvVar24 = top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar5 != pMVar13; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
            {
              fVar29 = -3.4028235e+38;
              for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                fVar1 = *(float *)((long)pvVar27 + uVar21 * 4);
                if (fVar29 <= fVar1) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)pvVar24 + (long)pMVar5 * 4 + (long)iVar3 * (long)pMVar4 * sVar2) =
                   fVar29;
              pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
            }
          }
        }
      }
      else if (uVar22 == 2) {
        uVar22 = bottom_blob->w;
        pMVar8 = (Mat *)(ulong)uVar22;
        uVar6 = bottom_blob->h;
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar63._0_8_ = SUB168(auVar44 ^ auVar38,0) << 0x3f;
        auVar63._8_8_ = SUB168(auVar44 ^ auVar38,8) << 0x3f;
        iVar3 = movmskpd(uVar7,auVar63);
        if (iVar3 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar6;
          Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
          iVar3 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pvVar24 = bottom_blob->data;
            iVar3 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar18 = (Mat *)0x0;
            if ((int)uVar22 < 1) {
              pMVar8 = pMVar18;
            }
            pMVar4 = (Mat *)(ulong)uVar6;
            if ((int)uVar6 < 1) {
              pMVar4 = pMVar18;
            }
            for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
              fVar29 = -3.4028235e+38;
              for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
                if (fVar29 <= fVar1) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar18 * 4) = fVar29;
              pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
            }
            fVar29 = -3.4028235e+38;
            for (pMVar8 = (Mat *)0x0; pMVar4 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar8 * 4);
              if (fVar29 <= fVar1) {
                fVar29 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar29;
            iVar3 = 0;
          }
          goto LAB_001dfac3;
        }
        bVar17 = (byte)iVar3 >> 1;
        pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
        if (((bVar10 | bVar17) & 1) == 0) {
          Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar27 = top_blob->data;
          pMVar18 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar18;
          }
          pMVar4 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar4 = pMVar18;
          }
          for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
            fVar29 = -3.4028235e+38;
            for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
              if (fVar29 <= fVar1) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)pvVar27 + (long)pMVar18 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
        else if (((bVar11 | (byte)iVar3) & 1) == 0) {
          pMVar18 = pMVar8;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,-3.4028235e+38);
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar4 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar4;
          }
          pvVar24 = bottom_blob->data;
          pMVar13 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar13 = pMVar4;
          }
          for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            pMVar18 = (Mat *)top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar5 * 4);
              fVar29 = *(float *)((long)&pMVar18->data + (long)pMVar5 * 4);
              if (fVar1 <= fVar29) {
                fVar1 = fVar29;
              }
              *(float *)((long)&pMVar18->data + (long)pMVar5 * 4) = fVar1;
            }
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
      }
      else if (uVar22 == 1) {
        uVar22 = bottom_blob->w;
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        uVar21 = 0;
        uVar16 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar16 = uVar21;
        }
        fVar29 = -3.4028235e+38;
        for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          fVar1 = *(float *)((long)bottom_blob->data + uVar21 * 4);
          if (fVar29 <= fVar1) {
            fVar29 = fVar1;
          }
        }
        goto LAB_001dcd7b;
      }
    }
    else if (uVar22 == 3) {
      uVar22 = bottom_blob->w;
      lVar19 = (long)(int)uVar22;
      uVar6 = bottom_blob->h;
      uVar23 = bottom_blob->c;
      uVar16 = (ulong)uVar23;
      uVar14 = uVar6 * uVar22;
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar55._0_8_ = SUB168(auVar44 ^ auVar33,0) << 0x3f;
      auVar55._8_8_ = SUB168(auVar44 ^ auVar33,8) << 0x3f;
      iVar3 = movmskpd(3,auVar55);
      bVar17 = reduce_c ^ 1;
      if (iVar3 == 0 && bVar17 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar23;
        Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
        iVar3 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar21 = 0;
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar16 = 0;
          }
          for (; uVar21 != uVar16; uVar21 = uVar21 + 1) {
            pMVar18 = bottom_blob;
            Mat::channel(&local_88,bottom_blob,(int)uVar21);
            pvVar24 = local_88.data;
            Mat::~Mat(&local_88);
            fVar29 = -3.4028235e+38;
            for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
              fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
              if (fVar29 <= fVar1) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)sums.data + uVar21 * 4) = fVar29;
          }
          fVar29 = -3.4028235e+38;
          for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
            fVar1 = *(float *)((long)sums.data + uVar21 * 4);
            if (fVar29 <= fVar1) {
              fVar29 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar29;
          iVar3 = 0;
        }
        goto LAB_001dfac3;
      }
      if (iVar3 == 0 && reduce_c == false) {
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar23,sVar2,opt->blob_allocator);
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        iVar3 = 0;
        if ((int)uVar23 < 1) {
          uVar16 = 0;
          iVar3 = 0;
        }
        for (; iVar3 != (int)uVar16; iVar3 = iVar3 + 1) {
          Mat::channel(&sums,bottom_blob,iVar3);
          pvVar24 = sums.data;
          Mat::~Mat(&sums);
          pMVar18 = top_blob;
          Mat::channel(&sums,top_blob,iVar3);
          pvVar27 = sums.data;
          Mat::~Mat(&sums);
          fVar29 = -3.4028235e+38;
          for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
            fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
            if (fVar29 <= fVar1) {
              fVar29 = fVar1;
            }
          }
          *(float *)pvVar27 = fVar29;
        }
      }
      else {
        bVar20 = (byte)iVar3 >> 1 | bVar10;
        if (reduce_c == false && (bVar20 & 1) == 0) {
          pMVar18 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar6,uVar23,sVar2,opt->blob_allocator);
          uVar16 = 0;
          if (0 < (int)uVar22) {
            uVar16 = (ulong)uVar22;
          }
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
            Mat::channel(&sums,bottom_blob,uVar22);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            pMVar18 = top_blob;
            Mat::channel(&sums,top_blob,uVar22);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
              fVar29 = -3.4028235e+38;
              for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
                if (fVar29 <= fVar1) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
              pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
            }
          }
        }
        else {
          if ((bVar20 & 1) == 0 && bVar17 == 0) {
            Mat::create(top_blob,1,uVar6,1,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
            iVar3 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,-3.4028235e+38);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
                  fVar29 = -3.4028235e+38;
                  for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                    fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
                    if (fVar29 <= fVar1) {
                      fVar29 = fVar1;
                    }
                  }
                  *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,-3.4028235e+38);
              iVar3 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                  fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                  fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                  if (fVar29 <= fVar1) {
                    fVar29 = fVar1;
                  }
                  *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                }
              }
            }
          }
          else {
            bVar20 = (byte)iVar3 | bVar11;
            pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar20);
            if ((bVar20 & 1) != 0 || bVar17 != 0) {
              if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,uVar6,1,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,-3.4028235e+38);
                uVar22 = 0;
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  pvVar24 = top_blob->data;
                  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                    fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                    fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                    if (fVar29 <= fVar1) {
                      fVar29 = fVar1;
                    }
                    *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                  }
                }
              }
              else if (reduce_c == false && (bVar20 & 1) == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,1,uVar23,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,-3.4028235e+38);
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar24 = sums.data;
                  Mat::~Mat(&sums);
                  pMVar18 = top_blob;
                  Mat::channel(&sums,top_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                      fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                      if (fVar1 <= fVar29) {
                        fVar1 = fVar29;
                      }
                      *(float *)((long)pvVar27 + uVar21 * 4) = fVar1;
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
              }
              goto LAB_001dfad6;
            }
            Mat::create(top_blob,uVar22,1,1,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)(ulong)uVar22;
            Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
            iVar3 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,-3.4028235e+38);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                    fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                    if (fVar1 <= fVar29) {
                      fVar1 = fVar29;
                    }
                    *(float *)((long)pvVar27 + uVar21 * 4) = fVar1;
                  }
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,-3.4028235e+38);
              iVar3 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                  fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                  fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                  if (fVar29 <= fVar1) {
                    fVar29 = fVar1;
                  }
                  *(float *)((long)pvVar24 + uVar21 * 4) = fVar29;
                }
              }
            }
          }
LAB_001dfac3:
          Mat::~Mat(&sums);
          if (iVar3 != 0) {
            return -100;
          }
        }
      }
    }
    else if (uVar22 == 2) {
      uVar22 = bottom_blob->w;
      pMVar8 = (Mat *)(ulong)uVar22;
      uVar6 = bottom_blob->h;
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar54._0_8_ = SUB168(auVar44 ^ auVar32,0) << 0x3f;
      auVar54._8_8_ = SUB168(auVar44 ^ auVar32,8) << 0x3f;
      iVar3 = movmskpd(uVar7,auVar54);
      if (iVar3 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar6;
        Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
        iVar3 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar18 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar18;
          }
          pMVar4 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar4 = pMVar18;
          }
          for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
            fVar29 = -3.4028235e+38;
            for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
              if (fVar29 <= fVar1) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)sums.data + (long)pMVar18 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
          fVar29 = -3.4028235e+38;
          for (pMVar8 = (Mat *)0x0; pMVar4 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            fVar1 = *(float *)((long)sums.data + (long)pMVar8 * 4);
            if (fVar29 <= fVar1) {
              fVar29 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar29;
          iVar3 = 0;
        }
        goto LAB_001dfac3;
      }
      bVar17 = (byte)iVar3 >> 1;
      pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
      if (((bVar10 | bVar17) & 1) == 0) {
        Mat::create(top_blob,1,uVar6,sVar2,opt->blob_allocator);
        pvVar24 = bottom_blob->data;
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pvVar27 = top_blob->data;
        pMVar18 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar8 = pMVar18;
        }
        pMVar4 = (Mat *)(ulong)uVar6;
        if ((int)uVar6 < 1) {
          pMVar4 = pMVar18;
        }
        for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
          fVar29 = -3.4028235e+38;
          for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13; pMVar13 = (Mat *)((long)&pMVar13->data + 1))
          {
            fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
            if (fVar29 <= fVar1) {
              fVar29 = fVar1;
            }
          }
          *(float *)((long)pvVar27 + (long)pMVar18 * 4) = fVar29;
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
      }
      else if (((bVar11 | (byte)iVar3) & 1) == 0) {
        pMVar18 = pMVar8;
        Mat::create(top_blob,uVar22,1,sVar2,opt->blob_allocator);
        Mat::fill(top_blob,-3.4028235e+38);
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pMVar4 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar8 = pMVar4;
        }
        pvVar24 = bottom_blob->data;
        pMVar13 = (Mat *)(ulong)uVar6;
        if ((int)uVar6 < 1) {
          pMVar13 = pMVar4;
        }
        for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
          pMVar18 = (Mat *)top_blob->data;
          for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar1 = *(float *)((long)pvVar24 + (long)pMVar5 * 4);
            fVar29 = *(float *)((long)&pMVar18->data + (long)pMVar5 * 4);
            if (fVar1 <= fVar29) {
              fVar1 = fVar29;
            }
            *(float *)((long)&pMVar18->data + (long)pMVar5 * 4) = fVar1;
          }
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
      }
    }
    else if (uVar22 == 1) {
      uVar22 = bottom_blob->w;
      pMVar18 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      uVar21 = 0;
      uVar16 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar16 = uVar21;
      }
      fVar29 = -3.4028235e+38;
      for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
        fVar1 = *(float *)((long)bottom_blob->data + uVar21 * 4);
        if (fVar29 <= fVar1) {
          fVar29 = fVar1;
        }
      }
LAB_001dcd7b:
      *(float *)top_blob->data = fVar29;
    }
LAB_001dfad6:
    if (ABS(fVar28 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_001dfbcb;
  case 5:
    fVar28 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar22 == 3) {
        uVar22 = bottom_blob->w;
        lVar19 = (long)(int)uVar22;
        uVar6 = bottom_blob->h;
        uVar23 = bottom_blob->c;
        pMVar8 = (Mat *)(ulong)uVar23;
        uVar14 = uVar6 * uVar22;
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar68._0_8_ = SUB168(auVar44 ^ auVar42,0) << 0x3f;
        auVar68._8_8_ = SUB168(auVar44 ^ auVar42,8) << 0x3f;
        iVar3 = movmskpd(3,auVar68);
        bVar17 = reduce_c ^ 1;
        if (iVar3 == 0 && bVar17 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar23;
          Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
          iVar3 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar4 = (Mat *)0x0;
            if ((int)uVar14 < 1) {
              uVar14 = 0;
            }
            if ((int)uVar23 < 1) {
              pMVar8 = (Mat *)0x0;
            }
            for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              pMVar18 = bottom_blob;
              Mat::channel(&local_88,bottom_blob,(int)pMVar4);
              pvVar24 = local_88.data;
              Mat::~Mat(&local_88);
              fVar29 = 3.4028235e+38;
              for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                if (fVar1 <= fVar29) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar4 * 4) = fVar29;
            }
            fVar29 = 3.4028235e+38;
            for (pMVar4 = (Mat *)0x0; pMVar8 != pMVar4; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar4 * 4);
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar29;
            iVar3 = 0;
          }
          goto LAB_001dfb2e;
        }
        if (iVar3 == 0 && reduce_c == false) {
          pMVar18 = pMVar8;
          Mat::create(top_blob,uVar23,sVar2,opt->blob_allocator);
          pMVar13 = (Mat *)0x0;
          pMVar4 = (Mat *)(ulong)uVar14;
          if ((int)uVar14 < 1) {
            pMVar4 = pMVar13;
          }
          if ((int)uVar23 < 1) {
            pMVar8 = pMVar13;
          }
          for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
            pMVar18 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar13);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            fVar29 = 3.4028235e+38;
            for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar5 * 4);
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)top_blob->data + (long)pMVar13 * 4) = fVar29;
          }
        }
        else {
          bVar20 = (byte)iVar3 >> 1 | bVar10;
          if (reduce_c != false || (bVar20 & 1) != 0) {
            if ((bVar20 & 1) == 0 && bVar17 == 0) {
              Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
              pMVar18 = (Mat *)0x1;
              Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
              iVar3 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,3.4028235e+38);
                uVar14 = 0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                  Mat::channel(&local_88,bottom_blob,uVar14);
                  pvVar24 = local_88.data;
                  Mat::~Mat(&local_88);
                  pMVar18 = &sums;
                  Mat::channel(&local_88,pMVar18,uVar14);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
                    fVar29 = 3.4028235e+38;
                    for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                      fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
                      if (fVar1 <= fVar29) {
                        fVar29 = fVar1;
                      }
                    }
                    *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
                Mat::fill(top_blob,3.4028235e+38);
                iVar3 = 0;
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = &sums;
                  Mat::channel(&local_88,&sums,uVar22);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  pvVar24 = top_blob->data;
                  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                    fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                    fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                    if (fVar1 <= fVar29) {
                      fVar29 = fVar1;
                    }
                    *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                  }
                }
              }
            }
            else {
              bVar20 = (byte)iVar3 | bVar11;
              pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar20);
              if ((bVar20 & 1) != 0 || bVar17 != 0) {
                if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                  pMVar18 = (Mat *)(ulong)uVar22;
                  Mat::create(top_blob,uVar22,uVar6,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,3.4028235e+38);
                  uVar22 = 0;
                  if ((int)uVar14 < 1) {
                    uVar14 = 0;
                  }
                  if ((int)uVar23 < 1) {
                    uVar23 = 0;
                  }
                  for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                    pMVar18 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar22);
                    pvVar27 = sums.data;
                    Mat::~Mat(&sums);
                    pvVar24 = top_blob->data;
                    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                      fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                      fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                      if (fVar1 <= fVar29) {
                        fVar29 = fVar1;
                      }
                      *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                    }
                  }
                }
                else if (reduce_c == false && (bVar20 & 1) == 0) {
                  pMVar18 = (Mat *)(ulong)uVar22;
                  Mat::create(top_blob,uVar22,uVar23,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,3.4028235e+38);
                  pMVar4 = (Mat *)0x0;
                  uVar16 = 0;
                  if (0 < (int)uVar22) {
                    uVar16 = (ulong)uVar22;
                  }
                  if ((int)uVar6 < 1) {
                    uVar6 = 0;
                  }
                  if ((int)uVar23 < 1) {
                    pMVar8 = pMVar4;
                  }
                  for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
                    pMVar18 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,(int)pMVar4);
                    pvVar27 = sums.data;
                    Mat::~Mat(&sums);
                    lVar12 = top_blob->elemsize * (long)pMVar4 * (long)top_blob->w;
                    pvVar24 = top_blob->data;
                    for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                      for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                        fVar1 = *(float *)((long)pvVar27 + uVar21 * 4);
                        fVar29 = *(float *)((long)pvVar24 + uVar21 * 4 + lVar12);
                        if (fVar29 <= fVar1) {
                          fVar1 = fVar29;
                        }
                        *(float *)((long)pvVar24 + uVar21 * 4 + lVar12) = fVar1;
                      }
                      pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
                    }
                  }
                }
                goto joined_r0x001dfbc5;
              }
              Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
              pMVar18 = (Mat *)(ulong)uVar22;
              Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
              iVar3 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,3.4028235e+38);
                uVar14 = 0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                  Mat::channel(&local_88,bottom_blob,uVar14);
                  pvVar24 = local_88.data;
                  Mat::~Mat(&local_88);
                  pMVar18 = &sums;
                  Mat::channel(&local_88,pMVar18,uVar14);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                      fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                      if (fVar29 <= fVar1) {
                        fVar1 = fVar29;
                      }
                      *(float *)((long)pvVar27 + uVar21 * 4) = fVar1;
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
                Mat::fill(top_blob,3.4028235e+38);
                iVar3 = 0;
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = &sums;
                  Mat::channel(&local_88,&sums,uVar22);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  pvVar24 = top_blob->data;
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                    fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                    if (fVar1 <= fVar29) {
                      fVar29 = fVar1;
                    }
                    *(float *)((long)pvVar24 + uVar21 * 4) = fVar29;
                  }
                }
              }
            }
            goto LAB_001dfb2e;
          }
          pMVar18 = (Mat *)(ulong)uVar6;
          Mat::create(top_blob,uVar6,uVar23,sVar2,opt->blob_allocator);
          pMVar4 = (Mat *)0x0;
          uVar16 = 0;
          if (0 < (int)uVar22) {
            uVar16 = (ulong)uVar22;
          }
          pMVar13 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar13 = pMVar4;
          }
          if ((int)uVar23 < 1) {
            pMVar8 = pMVar4;
          }
          for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            pMVar18 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar4);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            iVar3 = top_blob->w;
            sVar2 = top_blob->elemsize;
            pvVar24 = top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar5 != pMVar13; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
            {
              fVar29 = 3.4028235e+38;
              for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                fVar1 = *(float *)((long)pvVar27 + uVar21 * 4);
                if (fVar1 <= fVar29) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)pvVar24 + (long)pMVar5 * 4 + (long)iVar3 * (long)pMVar4 * sVar2) =
                   fVar29;
              pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
            }
          }
        }
      }
      else if (uVar22 == 2) {
        uVar22 = bottom_blob->w;
        pMVar8 = (Mat *)(ulong)uVar22;
        uVar6 = bottom_blob->h;
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar65._0_8_ = SUB168(auVar44 ^ auVar40,0) << 0x3f;
        auVar65._8_8_ = SUB168(auVar44 ^ auVar40,8) << 0x3f;
        iVar3 = movmskpd(uVar7,auVar65);
        if (iVar3 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar6;
          Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
          iVar3 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pvVar24 = bottom_blob->data;
            iVar3 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar18 = (Mat *)0x0;
            if ((int)uVar22 < 1) {
              pMVar8 = pMVar18;
            }
            pMVar4 = (Mat *)(ulong)uVar6;
            if ((int)uVar6 < 1) {
              pMVar4 = pMVar18;
            }
            for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
              fVar29 = 3.4028235e+38;
              for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
                if (fVar1 <= fVar29) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)sums.data + (long)pMVar18 * 4) = fVar29;
              pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
            }
            fVar29 = 3.4028235e+38;
            for (pMVar8 = (Mat *)0x0; pMVar4 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              fVar1 = *(float *)((long)sums.data + (long)pMVar8 * 4);
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
            }
            *(float *)top_blob->data = fVar29;
            iVar3 = 0;
          }
          goto LAB_001dfb2e;
        }
        bVar17 = (byte)iVar3 >> 1;
        pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
        if (((bVar10 | bVar17) & 1) == 0) {
          Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar27 = top_blob->data;
          pMVar18 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar18;
          }
          pMVar4 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar4 = pMVar18;
          }
          for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
            fVar29 = 3.4028235e+38;
            for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)pvVar27 + (long)pMVar18 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
        else if (((bVar11 | (byte)iVar3) & 1) == 0) {
          pMVar18 = pMVar8;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,3.4028235e+38);
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar4 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar4;
          }
          pvVar24 = bottom_blob->data;
          pMVar13 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar13 = pMVar4;
          }
          for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            pMVar18 = (Mat *)top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar5 * 4);
              fVar29 = *(float *)((long)&pMVar18->data + (long)pMVar5 * 4);
              if (fVar29 <= fVar1) {
                fVar1 = fVar29;
              }
              *(float *)((long)&pMVar18->data + (long)pMVar5 * 4) = fVar1;
            }
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
      }
      else if (uVar22 == 1) {
        uVar22 = bottom_blob->w;
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        uVar21 = 0;
        uVar16 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar16 = uVar21;
        }
        fVar29 = 3.4028235e+38;
        for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          fVar1 = *(float *)((long)bottom_blob->data + uVar21 * 4);
          if (fVar1 <= fVar29) {
            fVar29 = fVar1;
          }
        }
        goto LAB_001dcdee;
      }
    }
    else if (uVar22 == 3) {
      uVar22 = bottom_blob->w;
      lVar19 = (long)(int)uVar22;
      uVar6 = bottom_blob->h;
      uVar23 = bottom_blob->c;
      uVar16 = (ulong)uVar23;
      uVar14 = uVar6 * uVar22;
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar59._0_8_ = SUB168(auVar44 ^ auVar36,0) << 0x3f;
      auVar59._8_8_ = SUB168(auVar44 ^ auVar36,8) << 0x3f;
      iVar3 = movmskpd(3,auVar59);
      bVar17 = reduce_c ^ 1;
      if (iVar3 == 0 && bVar17 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar23;
        Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
        iVar3 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar21 = 0;
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar16 = 0;
          }
          for (; uVar21 != uVar16; uVar21 = uVar21 + 1) {
            pMVar18 = bottom_blob;
            Mat::channel(&local_88,bottom_blob,(int)uVar21);
            pvVar24 = local_88.data;
            Mat::~Mat(&local_88);
            fVar29 = 3.4028235e+38;
            for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
              fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)sums.data + uVar21 * 4) = fVar29;
          }
          fVar29 = 3.4028235e+38;
          for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
            fVar1 = *(float *)((long)sums.data + uVar21 * 4);
            if (fVar1 <= fVar29) {
              fVar29 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar29;
          iVar3 = 0;
        }
        goto LAB_001dfb2e;
      }
      if (iVar3 == 0 && reduce_c == false) {
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar23,sVar2,opt->blob_allocator);
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        iVar3 = 0;
        if ((int)uVar23 < 1) {
          uVar16 = 0;
          iVar3 = 0;
        }
        for (; iVar3 != (int)uVar16; iVar3 = iVar3 + 1) {
          Mat::channel(&sums,bottom_blob,iVar3);
          pvVar24 = sums.data;
          Mat::~Mat(&sums);
          pMVar18 = top_blob;
          Mat::channel(&sums,top_blob,iVar3);
          pvVar27 = sums.data;
          Mat::~Mat(&sums);
          fVar29 = 3.4028235e+38;
          for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
            fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
            if (fVar1 <= fVar29) {
              fVar29 = fVar1;
            }
          }
          *(float *)pvVar27 = fVar29;
        }
      }
      else {
        bVar20 = (byte)iVar3 >> 1 | bVar10;
        if (reduce_c == false && (bVar20 & 1) == 0) {
          pMVar18 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar6,uVar23,sVar2,opt->blob_allocator);
          uVar16 = 0;
          if (0 < (int)uVar22) {
            uVar16 = (ulong)uVar22;
          }
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
            Mat::channel(&sums,bottom_blob,uVar22);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            pMVar18 = top_blob;
            Mat::channel(&sums,top_blob,uVar22);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
              fVar29 = 3.4028235e+38;
              for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
                if (fVar1 <= fVar29) {
                  fVar29 = fVar1;
                }
              }
              *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
              pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
            }
          }
        }
        else {
          if ((bVar20 & 1) == 0 && bVar17 == 0) {
            Mat::create(top_blob,1,uVar6,1,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
            iVar3 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,3.4028235e+38);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
                  fVar29 = 3.4028235e+38;
                  for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                    fVar1 = *(float *)((long)pvVar24 + uVar9 * 4);
                    if (fVar1 <= fVar29) {
                      fVar29 = fVar1;
                    }
                  }
                  *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,3.4028235e+38);
              iVar3 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                  fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                  fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                  if (fVar1 <= fVar29) {
                    fVar29 = fVar1;
                  }
                  *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                }
              }
            }
          }
          else {
            bVar20 = (byte)iVar3 | bVar11;
            pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar20);
            if ((bVar20 & 1) != 0 || bVar17 != 0) {
              if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,uVar6,1,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,3.4028235e+38);
                uVar22 = 0;
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  pvVar24 = top_blob->data;
                  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                    fVar29 = *(float *)((long)pvVar27 + uVar16 * 4);
                    fVar1 = *(float *)((long)pvVar24 + uVar16 * 4);
                    if (fVar1 <= fVar29) {
                      fVar29 = fVar1;
                    }
                    *(float *)((long)pvVar24 + uVar16 * 4) = fVar29;
                  }
                }
              }
              else if (reduce_c == false && (bVar20 & 1) == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,1,uVar23,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,3.4028235e+38);
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar24 = sums.data;
                  Mat::~Mat(&sums);
                  pMVar18 = top_blob;
                  Mat::channel(&sums,top_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                      fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                      if (fVar29 <= fVar1) {
                        fVar1 = fVar29;
                      }
                      *(float *)((long)pvVar27 + uVar21 * 4) = fVar1;
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
              }
              goto joined_r0x001dfbc5;
            }
            Mat::create(top_blob,uVar22,1,1,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)(ulong)uVar22;
            Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
            iVar3 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,3.4028235e+38);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                    fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                    if (fVar29 <= fVar1) {
                      fVar1 = fVar29;
                    }
                    *(float *)((long)pvVar27 + uVar21 * 4) = fVar1;
                  }
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,3.4028235e+38);
              iVar3 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                  fVar29 = *(float *)((long)pvVar27 + uVar21 * 4);
                  fVar1 = *(float *)((long)pvVar24 + uVar21 * 4);
                  if (fVar1 <= fVar29) {
                    fVar29 = fVar1;
                  }
                  *(float *)((long)pvVar24 + uVar21 * 4) = fVar29;
                }
              }
            }
          }
LAB_001dfb2e:
          Mat::~Mat(&sums);
joined_r0x001dfba3:
          if (iVar3 != 0) {
            return -100;
          }
        }
      }
    }
    else if (uVar22 == 2) {
      uVar22 = bottom_blob->w;
      pMVar8 = (Mat *)(ulong)uVar22;
      uVar6 = bottom_blob->h;
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar56._0_8_ = SUB168(auVar44 ^ auVar34,0) << 0x3f;
      auVar56._8_8_ = SUB168(auVar44 ^ auVar34,8) << 0x3f;
      iVar3 = movmskpd(uVar7,auVar56);
      if (iVar3 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar6;
        Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
        iVar3 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar18 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar18;
          }
          pMVar4 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar4 = pMVar18;
          }
          for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
            fVar29 = 3.4028235e+38;
            for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
              if (fVar1 <= fVar29) {
                fVar29 = fVar1;
              }
            }
            *(float *)((long)sums.data + (long)pMVar18 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
          fVar29 = 3.4028235e+38;
          for (pMVar8 = (Mat *)0x0; pMVar4 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            fVar1 = *(float *)((long)sums.data + (long)pMVar8 * 4);
            if (fVar1 <= fVar29) {
              fVar29 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar29;
          iVar3 = 0;
        }
        goto LAB_001dfb2e;
      }
      bVar17 = (byte)iVar3 >> 1;
      pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
      if (((bVar10 | bVar17) & 1) == 0) {
        Mat::create(top_blob,1,uVar6,sVar2,opt->blob_allocator);
        pvVar24 = bottom_blob->data;
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pvVar27 = top_blob->data;
        pMVar18 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar8 = pMVar18;
        }
        pMVar4 = (Mat *)(ulong)uVar6;
        if ((int)uVar6 < 1) {
          pMVar4 = pMVar18;
        }
        for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
          fVar29 = 3.4028235e+38;
          for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13; pMVar13 = (Mat *)((long)&pMVar13->data + 1))
          {
            fVar1 = *(float *)((long)pvVar24 + (long)pMVar13 * 4);
            if (fVar1 <= fVar29) {
              fVar29 = fVar1;
            }
          }
          *(float *)((long)pvVar27 + (long)pMVar18 * 4) = fVar29;
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
      }
      else if (((bVar11 | (byte)iVar3) & 1) == 0) {
        pMVar18 = pMVar8;
        Mat::create(top_blob,uVar22,1,sVar2,opt->blob_allocator);
        Mat::fill(top_blob,3.4028235e+38);
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pMVar4 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar8 = pMVar4;
        }
        pvVar24 = bottom_blob->data;
        pMVar13 = (Mat *)(ulong)uVar6;
        if ((int)uVar6 < 1) {
          pMVar13 = pMVar4;
        }
        for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
          pMVar18 = (Mat *)top_blob->data;
          for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar1 = *(float *)((long)pvVar24 + (long)pMVar5 * 4);
            fVar29 = *(float *)((long)&pMVar18->data + (long)pMVar5 * 4);
            if (fVar29 <= fVar1) {
              fVar1 = fVar29;
            }
            *(float *)((long)&pMVar18->data + (long)pMVar5 * 4) = fVar1;
          }
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
      }
    }
    else if (uVar22 == 1) {
      uVar22 = bottom_blob->w;
      pMVar18 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      uVar21 = 0;
      uVar16 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar16 = uVar21;
      }
      fVar29 = 3.4028235e+38;
      for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
        fVar1 = *(float *)((long)bottom_blob->data + uVar21 * 4);
        if (fVar1 <= fVar29) {
          fVar29 = fVar1;
        }
      }
LAB_001dcdee:
      *(float *)top_blob->data = fVar29;
    }
    goto joined_r0x001dfbc5;
  case 6:
    fVar28 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar22 == 3) {
        uVar22 = bottom_blob->w;
        lVar19 = (long)(int)uVar22;
        uVar6 = bottom_blob->h;
        uVar23 = bottom_blob->c;
        pMVar8 = (Mat *)(ulong)uVar23;
        uVar14 = uVar6 * uVar22;
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar69._0_8_ = SUB168(auVar44 ^ auVar43,0) << 0x3f;
        auVar69._8_8_ = SUB168(auVar44 ^ auVar43,8) << 0x3f;
        iVar3 = movmskpd(3,auVar69);
        bVar17 = reduce_c ^ 1;
        if (iVar3 == 0 && bVar17 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar23;
          Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
          iVar3 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pMVar4 = (Mat *)0x0;
            if ((int)uVar14 < 1) {
              uVar14 = 0;
            }
            if ((int)uVar23 < 1) {
              pMVar8 = (Mat *)0x0;
            }
            for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              pMVar18 = bottom_blob;
              Mat::channel(&local_88,bottom_blob,(int)pMVar4);
              pvVar24 = local_88.data;
              Mat::~Mat(&local_88);
              fVar29 = 1.0;
              for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                fVar29 = fVar29 * *(float *)((long)pvVar24 + uVar16 * 4);
              }
              *(float *)((long)sums.data + (long)pMVar4 * 4) = fVar29;
            }
            fVar29 = 1.0;
            for (pMVar4 = (Mat *)0x0; pMVar8 != pMVar4; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              fVar29 = fVar29 * *(float *)((long)sums.data + (long)pMVar4 * 4);
            }
            *(float *)top_blob->data = fVar29;
            iVar3 = 0;
          }
          goto LAB_001dfb96;
        }
        if (iVar3 == 0 && reduce_c == false) {
          pMVar18 = pMVar8;
          Mat::create(top_blob,uVar23,sVar2,opt->blob_allocator);
          pMVar13 = (Mat *)0x0;
          pMVar4 = (Mat *)(ulong)uVar14;
          if ((int)uVar14 < 1) {
            pMVar4 = pMVar13;
          }
          if ((int)uVar23 < 1) {
            pMVar8 = pMVar13;
          }
          for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
            pMVar18 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar13);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            fVar29 = 1.0;
            for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar29 = fVar29 * *(float *)((long)pvVar24 + (long)pMVar5 * 4);
            }
            *(float *)((long)top_blob->data + (long)pMVar13 * 4) = fVar29;
          }
        }
        else {
          bVar20 = (byte)iVar3 >> 1 | bVar10;
          if (reduce_c != false || (bVar20 & 1) != 0) {
            if ((bVar20 & 1) == 0 && bVar17 == 0) {
              Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
              pMVar18 = (Mat *)0x1;
              Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
              iVar3 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,1.0);
                uVar14 = 0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                  Mat::channel(&local_88,bottom_blob,uVar14);
                  pvVar24 = local_88.data;
                  Mat::~Mat(&local_88);
                  pMVar18 = &sums;
                  Mat::channel(&local_88,pMVar18,uVar14);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
                    fVar29 = 1.0;
                    for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                      fVar29 = fVar29 * *(float *)((long)pvVar24 + uVar9 * 4);
                    }
                    *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
                Mat::fill(top_blob,1.0);
                iVar3 = 0;
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = &sums;
                  Mat::channel(&local_88,&sums,uVar22);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  pvVar24 = top_blob->data;
                  for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                    *(float *)((long)pvVar24 + uVar16 * 4) =
                         *(float *)((long)pvVar27 + uVar16 * 4) *
                         *(float *)((long)pvVar24 + uVar16 * 4);
                  }
                }
              }
            }
            else {
              bVar20 = (byte)iVar3 | bVar11;
              pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar20);
              if ((bVar20 & 1) != 0 || bVar17 != 0) {
                if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                  pMVar18 = (Mat *)(ulong)uVar22;
                  Mat::create(top_blob,uVar22,uVar6,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,1.0);
                  uVar22 = 0;
                  if ((int)uVar14 < 1) {
                    uVar14 = 0;
                  }
                  if ((int)uVar23 < 1) {
                    uVar23 = 0;
                  }
                  for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                    pMVar18 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,uVar22);
                    pvVar27 = sums.data;
                    Mat::~Mat(&sums);
                    pvVar24 = top_blob->data;
                    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                      *(float *)((long)pvVar24 + uVar16 * 4) =
                           *(float *)((long)pvVar27 + uVar16 * 4) *
                           *(float *)((long)pvVar24 + uVar16 * 4);
                    }
                  }
                }
                else if (reduce_c == false && (bVar20 & 1) == 0) {
                  pMVar18 = (Mat *)(ulong)uVar22;
                  Mat::create(top_blob,uVar22,uVar23,sVar2,opt->blob_allocator);
                  Mat::fill(top_blob,1.0);
                  pMVar4 = (Mat *)0x0;
                  uVar16 = 0;
                  if (0 < (int)uVar22) {
                    uVar16 = (ulong)uVar22;
                  }
                  if ((int)uVar6 < 1) {
                    uVar6 = 0;
                  }
                  if ((int)uVar23 < 1) {
                    pMVar8 = pMVar4;
                  }
                  for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
                    pMVar18 = bottom_blob;
                    Mat::channel(&sums,bottom_blob,(int)pMVar4);
                    pvVar27 = sums.data;
                    Mat::~Mat(&sums);
                    lVar12 = top_blob->elemsize * (long)pMVar4 * (long)top_blob->w;
                    pvVar24 = top_blob->data;
                    for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                      for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                        *(float *)((long)pvVar24 + uVar21 * 4 + lVar12) =
                             *(float *)((long)pvVar27 + uVar21 * 4) *
                             *(float *)((long)pvVar24 + uVar21 * 4 + lVar12);
                      }
                      pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
                    }
                  }
                }
                goto joined_r0x001dfbc5;
              }
              Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
              pMVar18 = (Mat *)(ulong)uVar22;
              Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
              iVar3 = -100;
              if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
                Mat::fill(&sums,1.0);
                uVar14 = 0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                  Mat::channel(&local_88,bottom_blob,uVar14);
                  pvVar24 = local_88.data;
                  Mat::~Mat(&local_88);
                  pMVar18 = &sums;
                  Mat::channel(&local_88,pMVar18,uVar14);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      *(float *)((long)pvVar27 + uVar21 * 4) =
                           *(float *)((long)pvVar24 + uVar21 * 4) *
                           *(float *)((long)pvVar27 + uVar21 * 4);
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
                Mat::fill(top_blob,1.0);
                iVar3 = 0;
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = &sums;
                  Mat::channel(&local_88,&sums,uVar22);
                  pvVar27 = local_88.data;
                  Mat::~Mat(&local_88);
                  pvVar24 = top_blob->data;
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    *(float *)((long)pvVar24 + uVar21 * 4) =
                         *(float *)((long)pvVar27 + uVar21 * 4) *
                         *(float *)((long)pvVar24 + uVar21 * 4);
                  }
                }
              }
            }
            goto LAB_001dfb96;
          }
          pMVar18 = (Mat *)(ulong)uVar6;
          Mat::create(top_blob,uVar6,uVar23,sVar2,opt->blob_allocator);
          pMVar4 = (Mat *)0x0;
          uVar16 = 0;
          if (0 < (int)uVar22) {
            uVar16 = (ulong)uVar22;
          }
          pMVar13 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar13 = pMVar4;
          }
          if ((int)uVar23 < 1) {
            pMVar8 = pMVar4;
          }
          for (; pMVar4 != pMVar8; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            pMVar18 = bottom_blob;
            Mat::channel(&sums,bottom_blob,(int)pMVar4);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            iVar3 = top_blob->w;
            sVar2 = top_blob->elemsize;
            pvVar24 = top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar5 != pMVar13; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
            {
              fVar29 = 1.0;
              for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                fVar29 = fVar29 * *(float *)((long)pvVar27 + uVar21 * 4);
              }
              *(float *)((long)pvVar24 + (long)pMVar5 * 4 + (long)iVar3 * (long)pMVar4 * sVar2) =
                   fVar29;
              pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
            }
          }
        }
      }
      else if (uVar22 == 2) {
        uVar22 = bottom_blob->w;
        pMVar8 = (Mat *)(ulong)uVar22;
        uVar6 = bottom_blob->h;
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar66._0_8_ = SUB168(auVar44 ^ auVar41,0) << 0x3f;
        auVar66._8_8_ = SUB168(auVar44 ^ auVar41,8) << 0x3f;
        iVar3 = movmskpd(uVar7,auVar66);
        if (iVar3 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar6;
          Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
          iVar3 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            pvVar24 = bottom_blob->data;
            iVar3 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar18 = (Mat *)0x0;
            if ((int)uVar22 < 1) {
              pMVar8 = pMVar18;
            }
            pMVar4 = (Mat *)(ulong)uVar6;
            if ((int)uVar6 < 1) {
              pMVar4 = pMVar18;
            }
            for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
              fVar29 = 1.0;
              for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                fVar29 = fVar29 * *(float *)((long)pvVar24 + (long)pMVar13 * 4);
              }
              *(float *)((long)sums.data + (long)pMVar18 * 4) = fVar29;
              pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
            }
            fVar29 = 1.0;
            for (pMVar8 = (Mat *)0x0; pMVar4 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
              fVar29 = fVar29 * *(float *)((long)sums.data + (long)pMVar8 * 4);
            }
            *(float *)top_blob->data = fVar29;
            iVar3 = 0;
          }
          goto LAB_001dfb96;
        }
        bVar17 = (byte)iVar3 >> 1;
        pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
        if (((bVar10 | bVar17) & 1) == 0) {
          Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar27 = top_blob->data;
          pMVar18 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar18;
          }
          pMVar4 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar4 = pMVar18;
          }
          for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
            fVar29 = 1.0;
            for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              fVar29 = fVar29 * *(float *)((long)pvVar24 + (long)pMVar13 * 4);
            }
            *(float *)((long)pvVar27 + (long)pMVar18 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
        else if (((bVar11 | (byte)iVar3) & 1) == 0) {
          pMVar18 = pMVar8;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,1.0);
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar4 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar4;
          }
          pvVar24 = bottom_blob->data;
          pMVar13 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar13 = pMVar4;
          }
          for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            pMVar18 = (Mat *)top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              *(float *)((long)&pMVar18->data + (long)pMVar5 * 4) =
                   *(float *)((long)pvVar24 + (long)pMVar5 * 4) *
                   *(float *)((long)&pMVar18->data + (long)pMVar5 * 4);
            }
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
      }
      else if (uVar22 == 1) {
        uVar22 = bottom_blob->w;
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        uVar21 = 0;
        uVar16 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar16 = uVar21;
        }
        fVar29 = 1.0;
        for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          fVar29 = fVar29 * *(float *)((long)bottom_blob->data + uVar21 * 4);
        }
        goto LAB_001dcdff;
      }
    }
    else if (uVar22 == 3) {
      uVar22 = bottom_blob->w;
      lVar19 = (long)(int)uVar22;
      uVar6 = bottom_blob->h;
      uVar23 = bottom_blob->c;
      uVar16 = (ulong)uVar23;
      uVar14 = uVar6 * uVar22;
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar60._0_8_ = SUB168(auVar44 ^ auVar37,0) << 0x3f;
      auVar60._8_8_ = SUB168(auVar44 ^ auVar37,8) << 0x3f;
      iVar3 = movmskpd(3,auVar60);
      bVar17 = reduce_c ^ 1;
      if (iVar3 == 0 && bVar17 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar23;
        Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
        iVar3 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar21 = 0;
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar16 = 0;
          }
          for (; uVar21 != uVar16; uVar21 = uVar21 + 1) {
            pMVar18 = bottom_blob;
            Mat::channel(&local_88,bottom_blob,(int)uVar21);
            pvVar24 = local_88.data;
            Mat::~Mat(&local_88);
            fVar29 = 1.0;
            for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
              fVar29 = fVar29 * *(float *)((long)pvVar24 + uVar9 * 4);
            }
            *(float *)((long)sums.data + uVar21 * 4) = fVar29;
          }
          fVar29 = 1.0;
          for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
            fVar29 = fVar29 * *(float *)((long)sums.data + uVar21 * 4);
          }
          *(float *)top_blob->data = fVar29;
          iVar3 = 0;
        }
        goto LAB_001dfb96;
      }
      if (iVar3 == 0 && reduce_c == false) {
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,1,uVar23,sVar2,opt->blob_allocator);
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        iVar3 = 0;
        if ((int)uVar23 < 1) {
          uVar16 = 0;
          iVar3 = 0;
        }
        for (; iVar3 != (int)uVar16; iVar3 = iVar3 + 1) {
          Mat::channel(&sums,bottom_blob,iVar3);
          pvVar24 = sums.data;
          Mat::~Mat(&sums);
          pMVar18 = top_blob;
          Mat::channel(&sums,top_blob,iVar3);
          pvVar27 = sums.data;
          Mat::~Mat(&sums);
          fVar29 = 1.0;
          for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
            fVar29 = fVar29 * *(float *)((long)pvVar24 + uVar21 * 4);
          }
          *(float *)pvVar27 = fVar29;
        }
      }
      else {
        bVar20 = (byte)iVar3 >> 1 | bVar10;
        if (reduce_c != false || (bVar20 & 1) != 0) {
          if ((bVar20 & 1) == 0 && bVar17 == 0) {
            Mat::create(top_blob,1,uVar6,1,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
            iVar3 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,1.0);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
                  fVar29 = 1.0;
                  for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                    fVar29 = fVar29 * *(float *)((long)pvVar24 + uVar9 * 4);
                  }
                  *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,1.0);
              iVar3 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)((long)pvVar24 + uVar16 * 4) =
                       *(float *)((long)pvVar27 + uVar16 * 4) *
                       *(float *)((long)pvVar24 + uVar16 * 4);
                }
              }
            }
          }
          else {
            bVar20 = (byte)iVar3 | bVar11;
            pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar20);
            if ((bVar20 & 1) != 0 || bVar17 != 0) {
              if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,uVar6,1,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,1.0);
                uVar22 = 0;
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  pvVar24 = top_blob->data;
                  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                    *(float *)((long)pvVar24 + uVar16 * 4) =
                         *(float *)((long)pvVar27 + uVar16 * 4) *
                         *(float *)((long)pvVar24 + uVar16 * 4);
                  }
                }
              }
              else if (reduce_c == false && (bVar20 & 1) == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,1,uVar23,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,1.0);
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                }
                for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar24 = sums.data;
                  Mat::~Mat(&sums);
                  pMVar18 = top_blob;
                  Mat::channel(&sums,top_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      *(float *)((long)pvVar27 + uVar21 * 4) =
                           *(float *)((long)pvVar24 + uVar21 * 4) *
                           *(float *)((long)pvVar27 + uVar21 * 4);
                    }
                    pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                  }
                }
              }
              goto joined_r0x001dfbc5;
            }
            Mat::create(top_blob,uVar22,1,1,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)(ulong)uVar22;
            Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
            iVar3 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,1.0);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    *(float *)((long)pvVar27 + uVar21 * 4) =
                         *(float *)((long)pvVar24 + uVar21 * 4) *
                         *(float *)((long)pvVar27 + uVar21 * 4);
                  }
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,1.0);
              iVar3 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar24 + uVar21 * 4) =
                       *(float *)((long)pvVar27 + uVar21 * 4) *
                       *(float *)((long)pvVar24 + uVar21 * 4);
                }
              }
            }
          }
LAB_001dfb96:
          Mat::~Mat(&sums);
          goto joined_r0x001dfba3;
        }
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,uVar6,uVar23,sVar2,opt->blob_allocator);
        uVar16 = 0;
        if (0 < (int)uVar22) {
          uVar16 = (ulong)uVar22;
        }
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
          Mat::channel(&sums,bottom_blob,uVar22);
          pvVar24 = sums.data;
          Mat::~Mat(&sums);
          pMVar18 = top_blob;
          Mat::channel(&sums,top_blob,uVar22);
          pvVar27 = sums.data;
          Mat::~Mat(&sums);
          for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
            fVar29 = 1.0;
            for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
              fVar29 = fVar29 * *(float *)((long)pvVar24 + uVar9 * 4);
            }
            *(float *)((long)pvVar27 + uVar21 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
          }
        }
      }
    }
    else if (uVar22 == 2) {
      uVar22 = bottom_blob->w;
      pMVar8 = (Mat *)(ulong)uVar22;
      uVar6 = bottom_blob->h;
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar57._0_8_ = SUB168(auVar44 ^ auVar35,0) << 0x3f;
      auVar57._8_8_ = SUB168(auVar44 ^ auVar35,8) << 0x3f;
      iVar3 = movmskpd(uVar7,auVar57);
      if (iVar3 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar6;
        Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
        iVar3 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar18 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar8 = pMVar18;
          }
          pMVar4 = (Mat *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar4 = pMVar18;
          }
          for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
            fVar29 = 1.0;
            for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13;
                pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              fVar29 = fVar29 * *(float *)((long)pvVar24 + (long)pMVar13 * 4);
            }
            *(float *)((long)sums.data + (long)pMVar18 * 4) = fVar29;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
          fVar29 = 1.0;
          for (pMVar8 = (Mat *)0x0; pMVar4 != pMVar8; pMVar8 = (Mat *)((long)&pMVar8->data + 1)) {
            fVar29 = fVar29 * *(float *)((long)sums.data + (long)pMVar8 * 4);
          }
          *(float *)top_blob->data = fVar29;
          iVar3 = 0;
        }
        goto LAB_001dfb96;
      }
      bVar17 = (byte)iVar3 >> 1;
      pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
      if (((bVar10 | bVar17) & 1) == 0) {
        Mat::create(top_blob,1,uVar6,sVar2,opt->blob_allocator);
        pvVar24 = bottom_blob->data;
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pvVar27 = top_blob->data;
        pMVar18 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar8 = pMVar18;
        }
        pMVar4 = (Mat *)(ulong)uVar6;
        if ((int)uVar6 < 1) {
          pMVar4 = pMVar18;
        }
        for (; pMVar18 != pMVar4; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
          fVar29 = 1.0;
          for (pMVar13 = (Mat *)0x0; pMVar8 != pMVar13; pMVar13 = (Mat *)((long)&pMVar13->data + 1))
          {
            fVar29 = fVar29 * *(float *)((long)pvVar24 + (long)pMVar13 * 4);
          }
          *(float *)((long)pvVar27 + (long)pMVar18 * 4) = fVar29;
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
      }
      else if (((bVar11 | (byte)iVar3) & 1) == 0) {
        pMVar18 = pMVar8;
        Mat::create(top_blob,uVar22,1,sVar2,opt->blob_allocator);
        Mat::fill(top_blob,1.0);
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pMVar4 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar8 = pMVar4;
        }
        pvVar24 = bottom_blob->data;
        pMVar13 = (Mat *)(ulong)uVar6;
        if ((int)uVar6 < 1) {
          pMVar13 = pMVar4;
        }
        for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
          pMVar18 = (Mat *)top_blob->data;
          for (pMVar5 = (Mat *)0x0; pMVar8 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            *(float *)((long)&pMVar18->data + (long)pMVar5 * 4) =
                 *(float *)((long)pvVar24 + (long)pMVar5 * 4) *
                 *(float *)((long)&pMVar18->data + (long)pMVar5 * 4);
          }
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
      }
    }
    else if (uVar22 == 1) {
      uVar22 = bottom_blob->w;
      pMVar18 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      uVar21 = 0;
      uVar16 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar16 = uVar21;
      }
      fVar29 = 1.0;
      for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
        fVar29 = fVar29 * *(float *)((long)bottom_blob->data + uVar21 * 4);
      }
LAB_001dcdff:
      *(float *)top_blob->data = fVar29;
    }
joined_r0x001dfbc5:
    if (1.1920929e-07 < ABS(fVar28 + -1.0)) {
LAB_001dfbcb:
      reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar28,(Option *)pMVar18);
    }
    return 0;
  case 7:
    post_process_00 = (undefined1)this->keepdims;
    auVar48._0_8_ = lVar19 << 0x3f;
    auVar48._8_8_ = lVar12 << 0x3f;
    uVar7 = movmskpd(uVar6,auVar48);
    bVar11 = (byte)uVar7;
    fVar28 = 1.0;
LAB_001dc90e:
    iVar3 = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar28,(bool)(bVar11 >> 1),(bool)(bVar11 & 1),reduce_c,
                       (bool)post_process_00,0.0,(int)opt,in_stack_fffffffffffffef0);
    return iVar3;
  case 8:
    if (this->keepdims == 0) {
      auVar53._0_8_ = lVar19 << 0x3f;
      auVar53._8_8_ = lVar12 << 0x3f;
      uVar7 = movmskpd(uVar6,auVar53);
      iVar3 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar28,(bool)((byte)uVar7 >> 1),
                         (bool)((byte)uVar7 & 1),reduce_c,opt);
    }
    else {
      auVar50._0_8_ = lVar19 << 0x3f;
      auVar50._8_8_ = lVar12 << 0x3f;
      uVar7 = movmskpd(uVar6,auVar50);
      iVar3 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar28,(bool)((byte)uVar7 >> 1),
                         (bool)((byte)uVar7 & 1),reduce_c,opt);
    }
    if (iVar3 == 0) {
      iVar3 = top_blob->dims;
      if (iVar3 == 3) {
        iVar3 = top_blob->c;
        uVar22 = top_blob->h * top_blob->w;
        if (iVar3 != 1) {
          uVar16 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar16 = 0;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          for (iVar15 = 0; iVar15 != iVar3; iVar15 = iVar15 + 1) {
            Mat::channel(&sums,top_blob,iVar15);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar24 + uVar21 * 4) = SQRT(*(float *)((long)pvVar24 + uVar21 * 4));
            }
          }
          return 0;
        }
        pvVar24 = top_blob->data;
        uVar16 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar16 = 0;
        }
        for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          *(float *)((long)pvVar24 + uVar21 * 4) = SQRT(*(float *)((long)pvVar24 + uVar21 * 4));
        }
        return 0;
      }
      if (iVar3 == 2) {
        uVar22 = top_blob->h * top_blob->w;
        pvVar24 = top_blob->data;
        uVar16 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar16 = 0;
        }
        for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          *(float *)((long)pvVar24 + uVar21 * 4) = SQRT(*(float *)((long)pvVar24 + uVar21 * 4));
        }
        return 0;
      }
      if (iVar3 == 1) {
        pvVar24 = top_blob->data;
        uVar16 = (ulong)(uint)top_blob->w;
        if (top_blob->w < 1) {
          uVar16 = 0;
        }
        for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          *(float *)((long)pvVar24 + uVar21 * 4) = SQRT(*(float *)((long)pvVar24 + uVar21 * 4));
        }
        return 0;
      }
      return 0;
    }
    break;
  case 9:
    pMVar18 = top_blob;
    if (this->keepdims == 0) {
      auVar51._0_8_ = lVar19 << 0x3f;
      auVar51._8_8_ = lVar12 << 0x3f;
      uVar7 = movmskpd(uVar6,auVar51);
      iVar3 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar28,(bool)((byte)uVar7 >> 1),
                         (bool)((byte)uVar7 & 1),reduce_c,opt);
      fVar28 = extraout_XMM0_Da_00;
    }
    else {
      auVar46._0_8_ = lVar19 << 0x3f;
      auVar46._8_8_ = lVar12 << 0x3f;
      uVar7 = movmskpd(uVar6,auVar46);
      iVar3 = reduction_op_keepdims<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar28,(bool)((byte)uVar7 >> 1),
                         (bool)((byte)uVar7 & 1),reduce_c,opt);
      fVar28 = extraout_XMM0_Da;
    }
    if (iVar3 == 0) {
      reduction_post_process<ncnn::post_process_log<float>>(top_blob,fVar28,(Option *)pMVar18);
      return 0;
    }
    break;
  case 10:
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar22 == 3) {
        uVar22 = bottom_blob->w;
        lVar19 = (long)(int)uVar22;
        uVar6 = bottom_blob->h;
        pMVar8 = (Mat *)(ulong)uVar6;
        uVar23 = bottom_blob->c;
        uVar14 = uVar6 * uVar22;
        in_XMM0._8_4_ = 0xffffffff;
        in_XMM0._0_8_ = 0xffffffffffffffff;
        in_XMM0._12_4_ = 0xffffffff;
        auVar70._0_8_ = SUB168(auVar44 ^ in_XMM0,0) << 0x3f;
        auVar70._8_8_ = SUB168(auVar44 ^ in_XMM0,8) << 0x3f;
        iVar3 = movmskpd(uVar22,auVar70);
        bVar17 = reduce_c ^ 1;
        if (iVar3 == 0 && bVar17 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar23;
          Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
          local_f0 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            uVar21 = 0;
            uVar16 = (ulong)uVar14;
            if ((int)uVar14 < 1) {
              uVar16 = uVar21;
            }
            uVar9 = (ulong)uVar23;
            if ((int)uVar23 < 1) {
              uVar9 = uVar21;
            }
            for (; uVar21 != uVar9; uVar21 = uVar21 + 1) {
              pMVar18 = bottom_blob;
              Mat::channel(&local_88,bottom_blob,(int)uVar21);
              pvVar24 = local_88.data;
              Mat::~Mat(&local_88);
              fVar28 = 0.0;
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar29 = expf(*(float *)((long)pvVar24 + uVar25 * 4));
                fVar28 = fVar28 + fVar29;
              }
              *(float *)((long)sums.data + uVar21 * 4) = fVar28;
            }
            fVar28 = 0.0;
            for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
              fVar28 = fVar28 + *(float *)((long)sums.data + uVar16 * 4);
            }
            *(float *)top_blob->data = fVar28;
            local_f0 = 0;
          }
        }
        else {
          if (iVar3 == 0 && reduce_c == false) {
            pMVar18 = (Mat *)(ulong)uVar23;
            Mat::create(top_blob,uVar23,sVar2,opt->blob_allocator);
            uVar21 = 0;
            uVar16 = (ulong)uVar14;
            if ((int)uVar14 < 1) {
              uVar16 = uVar21;
            }
            uVar9 = (ulong)uVar23;
            in_XMM0 = extraout_XMM0_08;
            if ((int)uVar23 < 1) {
              uVar9 = uVar21;
            }
            for (; uVar21 != uVar9; uVar21 = uVar21 + 1) {
              pMVar18 = bottom_blob;
              Mat::channel(&sums,bottom_blob,(int)uVar21);
              pvVar24 = sums.data;
              Mat::~Mat(&sums);
              in_XMM0 = (undefined1  [16])0x0;
              for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
                fVar28 = expf(*(float *)((long)pvVar24 + uVar25 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
              }
              *(float *)((long)top_blob->data + uVar21 * 4) = in_XMM0._0_4_;
            }
            goto LAB_001e1c8b;
          }
          bVar20 = (byte)iVar3 >> 1 | bVar10;
          if (reduce_c == false && (bVar20 & 1) == 0) {
            pMVar18 = pMVar8;
            Mat::create(top_blob,uVar6,uVar23,sVar2,opt->blob_allocator);
            pMVar4 = (Mat *)0x0;
            uVar16 = 0;
            if (0 < (int)uVar22) {
              uVar16 = (ulong)uVar22;
            }
            if ((int)uVar6 < 1) {
              pMVar8 = pMVar4;
            }
            pMVar13 = (Mat *)(ulong)uVar23;
            if ((int)uVar23 < 1) {
              pMVar13 = pMVar4;
            }
            in_XMM0 = extraout_XMM0_12;
            for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
              pMVar18 = bottom_blob;
              Mat::channel(&sums,bottom_blob,(int)pMVar4);
              pvVar27 = sums.data;
              Mat::~Mat(&sums);
              iVar3 = top_blob->w;
              sVar2 = top_blob->elemsize;
              pvVar24 = top_blob->data;
              in_XMM0 = extraout_XMM0_13;
              for (pMVar5 = (Mat *)0x0; pMVar5 != pMVar8; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
              {
                in_XMM0 = (undefined1  [16])0x0;
                for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                  fVar28 = expf(*(float *)((long)pvVar27 + uVar21 * 4));
                  in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
                }
                *(float *)((long)pvVar24 + (long)pMVar5 * 4 + (long)iVar3 * (long)pMVar4 * sVar2) =
                     in_XMM0._0_4_;
                pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
              }
            }
            goto LAB_001e1c8b;
          }
          if ((bVar20 & 1) == 0 && bVar17 == 0) {
            Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)0x1;
            Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
            local_f0 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,0.0);
              pMVar4 = (Mat *)0x0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                pMVar8 = pMVar4;
              }
              pMVar13 = (Mat *)(ulong)uVar23;
              if ((int)uVar23 < 1) {
                pMVar13 = pMVar4;
              }
              while( true ) {
                local_98 = (int)pMVar13;
                iVar3 = (int)pMVar4;
                if (iVar3 == local_98) break;
                Mat::channel(&local_88,bottom_blob,iVar3);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,iVar3);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (pMVar4 = (Mat *)0x0; pMVar4 != pMVar8;
                    pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
                  fVar28 = 0.0;
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar29 = expf(*(float *)((long)pvVar24 + uVar21 * 4));
                    fVar28 = fVar28 + fVar29;
                  }
                  *(float *)((long)pvVar27 + (long)pMVar4 * 4) = fVar28;
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
                pMVar4 = (Mat *)(ulong)(iVar3 + 1);
              }
              Mat::fill(top_blob,0.0);
              local_f0 = 0;
              for (iVar3 = 0; iVar3 != local_98; iVar3 = iVar3 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,iVar3);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (pMVar4 = (Mat *)0x0; pMVar8 != pMVar4;
                    pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
                  *(float *)((long)pvVar24 + (long)pMVar4 * 4) =
                       *(float *)((long)pvVar27 + (long)pMVar4 * 4) +
                       *(float *)((long)pvVar24 + (long)pMVar4 * 4);
                }
              }
            }
          }
          else {
            bVar20 = (byte)iVar3 | bVar11;
            pMVar18 = (Mat *)CONCAT71((int7)(CONCAT44((int)uVar22 >> 0x1f,iVar3) >> 8),bVar20);
            if ((bVar20 & 1) != 0 || bVar17 != 0) {
              if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,uVar6,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,0.0);
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
                in_XMM0 = extraout_XMM0_16;
                uVar22 = 0;
                if ((int)uVar23 < 1) {
                  uVar23 = 0;
                  uVar22 = 0;
                }
                for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                  pMVar18 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,uVar22);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  pvVar24 = top_blob->data;
                  in_XMM0 = extraout_XMM0_17;
                  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                    fVar28 = expf(*(float *)((long)pvVar27 + uVar16 * 4));
                    in_XMM0._0_4_ = fVar28 + *(float *)((long)pvVar24 + uVar16 * 4);
                    in_XMM0._4_12_ = extraout_var_04;
                    *(float *)((long)pvVar24 + uVar16 * 4) = in_XMM0._0_4_;
                  }
                }
              }
              else if (reduce_c == false && (bVar20 & 1) == 0) {
                pMVar18 = (Mat *)(ulong)uVar22;
                Mat::create(top_blob,uVar22,uVar23,sVar2,opt->blob_allocator);
                Mat::fill(top_blob,0.0);
                pMVar4 = (Mat *)0x0;
                uVar16 = 0;
                if (0 < (int)uVar22) {
                  uVar16 = (ulong)uVar22;
                }
                if ((int)uVar6 < 1) {
                  pMVar8 = pMVar4;
                }
                pMVar13 = (Mat *)(ulong)uVar23;
                if ((int)uVar23 < 1) {
                  pMVar13 = pMVar4;
                }
                in_XMM0 = extraout_XMM0_03;
                for (; pMVar4 != pMVar13; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
                  pMVar18 = bottom_blob;
                  Mat::channel(&sums,bottom_blob,(int)pMVar4);
                  pvVar27 = sums.data;
                  Mat::~Mat(&sums);
                  lVar12 = top_blob->elemsize * (long)pMVar4 * (long)top_blob->w;
                  pvVar24 = top_blob->data;
                  in_XMM0 = extraout_XMM0_04;
                  for (iVar3 = 0; local_f8 = (int)pMVar8, iVar3 != local_f8; iVar3 = iVar3 + 1) {
                    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                      fVar28 = expf(*(float *)((long)pvVar27 + uVar21 * 4));
                      in_XMM0._0_4_ = fVar28 + *(float *)((long)pvVar24 + uVar21 * 4 + lVar12);
                      in_XMM0._4_12_ = extraout_var_02;
                      *(float *)((long)pvVar24 + uVar21 * 4 + lVar12) = in_XMM0._0_4_;
                    }
                    pvVar27 = (void *)((long)pvVar27 + lVar19 * 4);
                  }
                }
              }
              goto LAB_001e1c8b;
            }
            Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
            pMVar18 = (Mat *)(ulong)uVar22;
            Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
            local_f0 = -100;
            if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
              Mat::fill(&sums,0.0);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = uVar14;
              }
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&local_88,bottom_blob,uVar14);
                pvVar24 = local_88.data;
                Mat::~Mat(&local_88);
                pMVar18 = &sums;
                Mat::channel(&local_88,pMVar18,uVar14);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar28 = expf(*(float *)((long)pvVar24 + uVar21 * 4));
                    *(float *)((long)pvVar27 + uVar21 * 4) =
                         fVar28 + *(float *)((long)pvVar27 + uVar21 * 4);
                  }
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
              Mat::fill(top_blob,0.0);
              local_f0 = 0;
              for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = &sums;
                Mat::channel(&local_88,&sums,uVar22);
                pvVar27 = local_88.data;
                Mat::~Mat(&local_88);
                pvVar24 = top_blob->data;
                for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar24 + uVar21 * 4) =
                       *(float *)((long)pvVar27 + uVar21 * 4) +
                       *(float *)((long)pvVar24 + uVar21 * 4);
                }
              }
            }
          }
        }
      }
      else {
        if (uVar22 != 2) {
          if (uVar22 != 1) goto LAB_001e1c8b;
          uVar22 = bottom_blob->w;
          pMVar18 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pvVar24 = bottom_blob->data;
          uVar21 = 0;
          uVar16 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar16 = uVar21;
          }
          in_XMM0 = (undefined1  [16])0x0;
          for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
            fVar28 = expf(*(float *)((long)pvVar24 + uVar21 * 4));
            in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
          }
          goto LAB_001dce10;
        }
        uVar22 = bottom_blob->w;
        pMVar4 = (Mat *)(ulong)uVar22;
        uVar6 = bottom_blob->h;
        pMVar8 = (Mat *)(ulong)uVar6;
        in_XMM0._8_4_ = 0xffffffff;
        in_XMM0._0_8_ = 0xffffffffffffffff;
        in_XMM0._12_4_ = 0xffffffff;
        auVar67._0_8_ = SUB168(auVar44 ^ in_XMM0,0) << 0x3f;
        auVar67._8_8_ = SUB168(auVar44 ^ in_XMM0,8) << 0x3f;
        iVar3 = movmskpd(uVar7,auVar67);
        if (iVar3 != 0) {
          bVar17 = (byte)iVar3 >> 1;
          pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
          if (((bVar10 | bVar17) & 1) == 0) {
            pMVar18 = pMVar8;
            Mat::create(top_blob,uVar6,sVar2,opt->blob_allocator);
            pvVar24 = bottom_blob->data;
            iVar3 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar13 = (Mat *)0x0;
            if ((int)uVar22 < 1) {
              pMVar4 = pMVar13;
            }
            pvVar27 = top_blob->data;
            in_XMM0 = extraout_XMM0_07;
            if ((int)uVar6 < 1) {
              pMVar8 = pMVar13;
            }
            for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              in_XMM0 = ZEXT816(0);
              for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
              {
                fVar28 = expf(*(float *)((long)pvVar24 + (long)pMVar5 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
              }
              *(float *)((long)pvVar27 + (long)pMVar13 * 4) = in_XMM0._0_4_;
              pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
            }
          }
          else if (((bVar11 | (byte)iVar3) & 1) == 0) {
            pMVar18 = pMVar4;
            Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
            Mat::fill(top_blob,0.0);
            iVar3 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar13 = (Mat *)0x0;
            if ((int)uVar22 < 1) {
              pMVar4 = pMVar13;
            }
            pvVar24 = bottom_blob->data;
            in_XMM0 = extraout_XMM0_02;
            if ((int)uVar6 < 1) {
              pMVar8 = pMVar13;
            }
            for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
              pvVar27 = top_blob->data;
              for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1))
              {
                fVar28 = expf(*(float *)((long)pvVar24 + (long)pMVar5 * 4));
                in_XMM0._0_4_ = fVar28 + *(float *)((long)pvVar27 + (long)pMVar5 * 4);
                in_XMM0._4_12_ = extraout_var_01;
                *(float *)((long)pvVar27 + (long)pMVar5 * 4) = in_XMM0._0_4_;
              }
              pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
            }
          }
          goto LAB_001e1c8b;
        }
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        pMVar18 = pMVar8;
        Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
        local_f0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar13 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar4 = pMVar13;
          }
          pvVar24 = bottom_blob->data;
          if ((int)uVar6 < 1) {
            pMVar8 = pMVar13;
          }
          for (; fVar28 = 0.0, pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
            for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar29 = expf(*(float *)((long)pvVar24 + (long)pMVar5 * 4));
              fVar28 = fVar28 + fVar29;
            }
            *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar28;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
          for (pMVar4 = (Mat *)0x0; pMVar8 != pMVar4; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
            fVar28 = fVar28 + *(float *)((long)sums.data + (long)pMVar4 * 4);
          }
          *(float *)top_blob->data = fVar28;
          local_f0 = 0;
        }
      }
    }
    else if (uVar22 == 3) {
      uVar22 = bottom_blob->w;
      lVar19 = (long)(int)uVar22;
      uVar6 = bottom_blob->h;
      uVar23 = bottom_blob->c;
      uVar14 = uVar6 * uVar22;
      in_XMM0._8_4_ = 0xffffffff;
      in_XMM0._0_8_ = 0xffffffffffffffff;
      in_XMM0._12_4_ = 0xffffffff;
      auVar61._0_8_ = SUB168(auVar44 ^ in_XMM0,0) << 0x3f;
      auVar61._8_8_ = SUB168(auVar44 ^ in_XMM0,8) << 0x3f;
      iVar3 = movmskpd(uVar22,auVar61);
      bVar17 = reduce_c ^ 1;
      if (iVar3 == 0 && bVar17 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pMVar18 = (Mat *)(ulong)uVar23;
        Mat::Mat(&sums,uVar23,sVar2,opt->workspace_allocator);
        local_f0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          uVar21 = 0;
          uVar16 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar16 = uVar21;
          }
          uVar9 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar9 = uVar21;
          }
          for (; uVar21 != uVar9; uVar21 = uVar21 + 1) {
            pMVar18 = bottom_blob;
            Mat::channel(&local_88,bottom_blob,(int)uVar21);
            pvVar24 = local_88.data;
            Mat::~Mat(&local_88);
            fVar28 = 0.0;
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              fVar29 = expf(*(float *)((long)pvVar24 + uVar25 * 4));
              fVar28 = fVar28 + fVar29;
            }
            *(float *)((long)sums.data + uVar21 * 4) = fVar28;
          }
          fVar28 = 0.0;
          for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
            fVar28 = fVar28 + *(float *)((long)sums.data + uVar16 * 4);
          }
          *(float *)top_blob->data = fVar28;
          local_f0 = 0;
        }
      }
      else {
        if (iVar3 == 0 && reduce_c == false) {
          pMVar18 = (Mat *)0x1;
          Mat::create(top_blob,1,1,uVar23,sVar2,opt->blob_allocator);
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          in_XMM0 = extraout_XMM0_06;
          uVar22 = 0;
          if ((int)uVar23 < 1) {
            uVar23 = 0;
            uVar22 = 0;
          }
          for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
            Mat::channel(&sums,bottom_blob,uVar22);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            pMVar18 = top_blob;
            Mat::channel(&sums,top_blob,uVar22);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            in_XMM0 = (undefined1  [16])0x0;
            for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
              fVar28 = expf(*(float *)((long)pvVar24 + uVar16 * 4));
              in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
            }
            *(float *)pvVar27 = in_XMM0._0_4_;
          }
          goto LAB_001e1c8b;
        }
        bVar20 = (byte)iVar3 >> 1 | bVar10;
        if (reduce_c == false && (bVar20 & 1) == 0) {
          pMVar18 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar6,uVar23,sVar2,opt->blob_allocator);
          uVar21 = 0;
          uVar16 = 0;
          if (0 < (int)uVar22) {
            uVar16 = (ulong)uVar22;
          }
          uVar9 = (ulong)uVar6;
          if ((int)uVar6 < 1) {
            uVar9 = uVar21;
          }
          uVar25 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar25 = uVar21;
          }
          in_XMM0 = extraout_XMM0_09;
          while( true ) {
            local_98 = (int)uVar25;
            iVar3 = (int)uVar21;
            if (iVar3 == local_98) break;
            Mat::channel(&sums,bottom_blob,iVar3);
            pvVar24 = sums.data;
            Mat::~Mat(&sums);
            pMVar18 = top_blob;
            Mat::channel(&sums,top_blob,iVar3);
            pvVar27 = sums.data;
            Mat::~Mat(&sums);
            in_XMM0 = extraout_XMM0_10;
            for (uVar21 = 0; uVar21 != uVar9; uVar21 = uVar21 + 1) {
              in_XMM0 = (undefined1  [16])0x0;
              for (uVar26 = 0; uVar16 != uVar26; uVar26 = uVar26 + 1) {
                fVar28 = expf(*(float *)((long)pvVar24 + uVar26 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
              }
              *(float *)((long)pvVar27 + uVar21 * 4) = in_XMM0._0_4_;
              pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
            }
            uVar21 = (ulong)(iVar3 + 1);
          }
          goto LAB_001e1c8b;
        }
        if ((bVar20 & 1) == 0 && bVar17 == 0) {
          Mat::create(top_blob,1,uVar6,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)0x1;
          Mat::Mat(&sums,1,uVar6,uVar23,sVar2,opt->workspace_allocator);
          local_f0 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            Mat::fill(&sums,0.0);
            uVar21 = 0;
            uVar16 = 0;
            if (0 < (int)uVar22) {
              uVar16 = (ulong)uVar22;
            }
            uVar9 = (ulong)uVar6;
            if ((int)uVar6 < 1) {
              uVar9 = uVar21;
            }
            uVar25 = (ulong)uVar23;
            if ((int)uVar23 < 1) {
              uVar25 = uVar21;
            }
            while( true ) {
              local_98 = (int)uVar25;
              iVar3 = (int)uVar21;
              if (iVar3 == local_98) break;
              Mat::channel(&local_88,bottom_blob,iVar3);
              pvVar24 = local_88.data;
              Mat::~Mat(&local_88);
              pMVar18 = &sums;
              Mat::channel(&local_88,pMVar18,iVar3);
              pvVar27 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar21 = 0; uVar21 != uVar9; uVar21 = uVar21 + 1) {
                fVar28 = 0.0;
                for (uVar26 = 0; uVar16 != uVar26; uVar26 = uVar26 + 1) {
                  fVar29 = expf(*(float *)((long)pvVar24 + uVar26 * 4));
                  fVar28 = fVar28 + fVar29;
                }
                *(float *)((long)pvVar27 + uVar21 * 4) = fVar28;
                pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
              }
              uVar21 = (ulong)(iVar3 + 1);
            }
            Mat::fill(top_blob,0.0);
            local_f0 = 0;
            for (iVar3 = 0; iVar3 != local_98; iVar3 = iVar3 + 1) {
              pMVar18 = &sums;
              Mat::channel(&local_88,&sums,iVar3);
              pvVar27 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar24 = top_blob->data;
              for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar24 + uVar16 * 4) =
                     *(float *)((long)pvVar27 + uVar16 * 4) + *(float *)((long)pvVar24 + uVar16 * 4)
                ;
              }
            }
          }
        }
        else {
          bVar20 = (byte)iVar3 | bVar11;
          pMVar18 = (Mat *)CONCAT71((int7)(CONCAT44((int)uVar22 >> 0x1f,iVar3) >> 8),bVar20);
          if ((bVar20 & 1) != 0 || bVar17 != 0) {
            if (((bVar10 | bVar11) & 1) == 0 && bVar17 == 0) {
              pMVar18 = (Mat *)(ulong)uVar22;
              Mat::create(top_blob,uVar22,uVar6,1,sVar2,opt->blob_allocator);
              Mat::fill(top_blob,0.0);
              if ((int)uVar14 < 1) {
                uVar14 = 0;
              }
              in_XMM0 = extraout_XMM0_14;
              uVar22 = 0;
              if ((int)uVar23 < 1) {
                uVar23 = 0;
                uVar22 = 0;
              }
              for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
                pMVar18 = bottom_blob;
                Mat::channel(&sums,bottom_blob,uVar22);
                pvVar27 = sums.data;
                Mat::~Mat(&sums);
                pvVar24 = top_blob->data;
                in_XMM0 = extraout_XMM0_15;
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  fVar28 = expf(*(float *)((long)pvVar27 + uVar16 * 4));
                  in_XMM0._0_4_ = fVar28 + *(float *)((long)pvVar24 + uVar16 * 4);
                  in_XMM0._4_12_ = extraout_var_03;
                  *(float *)((long)pvVar24 + uVar16 * 4) = in_XMM0._0_4_;
                }
              }
            }
            else if (reduce_c == false && (bVar20 & 1) == 0) {
              pMVar18 = (Mat *)(ulong)uVar22;
              Mat::create(top_blob,uVar22,1,uVar23,sVar2,opt->blob_allocator);
              Mat::fill(top_blob,0.0);
              uVar14 = 0;
              uVar16 = 0;
              if (0 < (int)uVar22) {
                uVar16 = (ulong)uVar22;
              }
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              if ((int)uVar23 < 1) {
                uVar23 = 0;
              }
              in_XMM0 = extraout_XMM0_00;
              for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
                Mat::channel(&sums,bottom_blob,uVar14);
                pvVar24 = sums.data;
                Mat::~Mat(&sums);
                pMVar18 = top_blob;
                Mat::channel(&sums,top_blob,uVar14);
                pvVar27 = sums.data;
                Mat::~Mat(&sums);
                in_XMM0 = extraout_XMM0_01;
                for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                  for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                    fVar28 = expf(*(float *)((long)pvVar24 + uVar21 * 4));
                    in_XMM0._0_4_ = fVar28 + *(float *)((long)pvVar27 + uVar21 * 4);
                    in_XMM0._4_12_ = extraout_var_00;
                    *(float *)((long)pvVar27 + uVar21 * 4) = in_XMM0._0_4_;
                  }
                  pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
                }
              }
            }
            goto LAB_001e1c8b;
          }
          Mat::create(top_blob,uVar22,1,1,sVar2,opt->blob_allocator);
          pMVar18 = (Mat *)(ulong)uVar22;
          Mat::Mat(&sums,uVar22,1,uVar23,sVar2,opt->workspace_allocator);
          local_f0 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            Mat::fill(&sums,0.0);
            uVar14 = 0;
            uVar16 = 0;
            if (0 < (int)uVar22) {
              uVar16 = (ulong)uVar22;
            }
            if ((int)uVar6 < 1) {
              uVar6 = 0;
            }
            if ((int)uVar23 < 1) {
              uVar23 = uVar14;
            }
            for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
              Mat::channel(&local_88,bottom_blob,uVar14);
              pvVar24 = local_88.data;
              Mat::~Mat(&local_88);
              pMVar18 = &sums;
              Mat::channel(&local_88,pMVar18,uVar14);
              pvVar27 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
                for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                  fVar28 = expf(*(float *)((long)pvVar24 + uVar21 * 4));
                  *(float *)((long)pvVar27 + uVar21 * 4) =
                       fVar28 + *(float *)((long)pvVar27 + uVar21 * 4);
                }
                pvVar24 = (void *)((long)pvVar24 + lVar19 * 4);
              }
            }
            Mat::fill(top_blob,0.0);
            local_f0 = 0;
            for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
              pMVar18 = &sums;
              Mat::channel(&local_88,&sums,uVar22);
              pvVar27 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar24 = top_blob->data;
              for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
                *(float *)((long)pvVar24 + uVar21 * 4) =
                     *(float *)((long)pvVar27 + uVar21 * 4) + *(float *)((long)pvVar24 + uVar21 * 4)
                ;
              }
            }
          }
        }
      }
    }
    else {
      if (uVar22 != 2) {
        if (uVar22 != 1) goto LAB_001e1c8b;
        uVar22 = bottom_blob->w;
        pMVar18 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        pvVar24 = bottom_blob->data;
        uVar21 = 0;
        uVar16 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar16 = uVar21;
        }
        in_XMM0 = (undefined1  [16])0x0;
        for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          fVar28 = expf(*(float *)((long)pvVar24 + uVar21 * 4));
          in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
        }
LAB_001dce10:
        *(int *)top_blob->data = in_XMM0._0_4_;
        goto LAB_001e1c8b;
      }
      uVar22 = bottom_blob->w;
      pMVar4 = (Mat *)(ulong)uVar22;
      uVar6 = bottom_blob->h;
      pMVar8 = (Mat *)(ulong)uVar6;
      in_XMM0._8_4_ = 0xffffffff;
      in_XMM0._0_8_ = 0xffffffffffffffff;
      in_XMM0._12_4_ = 0xffffffff;
      auVar58._0_8_ = SUB168(auVar44 ^ in_XMM0,0) << 0x3f;
      auVar58._8_8_ = SUB168(auVar44 ^ in_XMM0,8) << 0x3f;
      iVar3 = movmskpd(uVar7,auVar58);
      if (iVar3 != 0) {
        bVar17 = (byte)iVar3 >> 1;
        pMVar18 = (Mat *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar17);
        if (((bVar10 | bVar17) & 1) == 0) {
          pMVar18 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar6,sVar2,opt->blob_allocator);
          pvVar24 = bottom_blob->data;
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar13 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar4 = pMVar13;
          }
          pvVar27 = top_blob->data;
          in_XMM0 = extraout_XMM0_05;
          if ((int)uVar6 < 1) {
            pMVar8 = pMVar13;
          }
          for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
            in_XMM0 = ZEXT816(0);
            for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar28 = expf(*(float *)((long)pvVar24 + (long)pMVar5 * 4));
              in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar28));
            }
            *(float *)((long)pvVar27 + (long)pMVar13 * 4) = in_XMM0._0_4_;
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
        else if (((bVar11 | (byte)iVar3) & 1) == 0) {
          pMVar18 = pMVar4;
          Mat::create(top_blob,uVar22,1,sVar2,opt->blob_allocator);
          Mat::fill(top_blob,0.0);
          iVar3 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar13 = (Mat *)0x0;
          if ((int)uVar22 < 1) {
            pMVar4 = pMVar13;
          }
          pvVar24 = bottom_blob->data;
          in_XMM0 = extraout_XMM0;
          if ((int)uVar6 < 1) {
            pMVar8 = pMVar13;
          }
          for (; pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
            pvVar27 = top_blob->data;
            for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
              fVar28 = expf(*(float *)((long)pvVar24 + (long)pMVar5 * 4));
              in_XMM0._0_4_ = fVar28 + *(float *)((long)pvVar27 + (long)pMVar5 * 4);
              in_XMM0._4_12_ = extraout_var;
              *(float *)((long)pvVar27 + (long)pMVar5 * 4) = in_XMM0._0_4_;
            }
            pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
          }
        }
        goto LAB_001e1c8b;
      }
      local_f0 = -100;
      Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
      pMVar18 = pMVar8;
      Mat::Mat(&sums,uVar6,sVar2,opt->workspace_allocator);
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        iVar3 = bottom_blob->w;
        sVar2 = bottom_blob->elemsize;
        pMVar13 = (Mat *)0x0;
        if ((int)uVar22 < 1) {
          pMVar4 = pMVar13;
        }
        pvVar24 = bottom_blob->data;
        if ((int)uVar6 < 1) {
          pMVar8 = pMVar13;
        }
        for (; fVar28 = 0.0, pMVar13 != pMVar8; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
          for (pMVar5 = (Mat *)0x0; pMVar4 != pMVar5; pMVar5 = (Mat *)((long)&pMVar5->data + 1)) {
            fVar29 = expf(*(float *)((long)pvVar24 + (long)pMVar5 * 4));
            fVar28 = fVar28 + fVar29;
          }
          *(float *)((long)sums.data + (long)pMVar13 * 4) = fVar28;
          pvVar24 = (void *)((long)pvVar24 + (long)iVar3 * sVar2);
        }
        for (pMVar4 = (Mat *)0x0; pMVar8 != pMVar4; pMVar4 = (Mat *)((long)&pMVar4->data + 1)) {
          fVar28 = fVar28 + *(float *)((long)sums.data + (long)pMVar4 * 4);
        }
        *(float *)top_blob->data = fVar28;
        local_f0 = 0;
      }
    }
    Mat::~Mat(&sums);
    in_XMM0 = extraout_XMM0_11;
    if (local_f0 != 0) {
      return -100;
    }
LAB_001e1c8b:
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,in_XMM0._0_4_,(Option *)pMVar18);
    return 0;
  }
  return -100;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}